

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::focusInEvent(QGraphicsView *this,QFocusEvent *event)

{
  bool bVar1;
  QObject *pQVar2;
  QEvent *in_RSI;
  QWidget *in_RDI;
  QGraphicsViewPrivate *d;
  QGraphicsViewPrivate *in_stack_00000050;
  QFocusEvent *in_stack_ffffffffffffffd8;
  
  d_func((QGraphicsView *)0xa3d681);
  QGraphicsViewPrivate::updateInputMethodSensitivity(in_stack_00000050);
  QWidget::focusInEvent(in_RDI,in_stack_ffffffffffffffd8);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3d6b0);
  if (bVar1) {
    pQVar2 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3d6c7)->
              super_QObject;
    QCoreApplication::sendEvent(pQVar2,in_RSI);
  }
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3d6e5);
  if ((!bVar1) || (bVar1 = QEvent::isAccepted(in_RSI), !bVar1)) {
    QWidget::focusInEvent(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QGraphicsView::focusInEvent(QFocusEvent *event)
{
    Q_D(QGraphicsView);
    d->updateInputMethodSensitivity();
    QAbstractScrollArea::focusInEvent(event);
    if (d->scene)
        QCoreApplication::sendEvent(d->scene, event);
    // Pass focus on if the scene cannot accept focus.
    if (!d->scene || !event->isAccepted())
        QAbstractScrollArea::focusInEvent(event);
}